

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O1

void lib::math::RegisterLibMath(State *state)

{
  Library lib;
  TableMemberReg math [29];
  Library LStack_2d8;
  TableMemberReg local_2c8;
  char *local_2b0;
  code *local_2a8;
  undefined4 local_2a0;
  char *local_298;
  code *local_290;
  undefined4 local_288;
  char *local_280;
  code *local_278;
  undefined4 local_270;
  char *local_268;
  code *local_260;
  undefined4 local_258;
  char *local_250;
  code *local_248;
  undefined4 local_240;
  char *local_238;
  code *local_230;
  undefined4 local_228;
  char *local_220;
  code *local_218;
  undefined4 local_210;
  char *local_208;
  code *local_200;
  undefined4 local_1f8;
  char *local_1f0;
  code *local_1e8;
  undefined4 local_1e0;
  char *local_1d8;
  code *local_1d0;
  undefined4 local_1c8;
  char *local_1c0;
  code *local_1b8;
  undefined4 local_1b0;
  char *local_1a8;
  code *local_1a0;
  undefined4 local_198;
  char *local_190;
  code *local_188;
  undefined4 local_180;
  char *local_178;
  code *local_170;
  undefined4 local_168;
  char *local_160;
  code *local_158;
  undefined4 local_150;
  char *local_148;
  code *local_140;
  undefined4 local_138;
  char *local_130;
  code *local_128;
  undefined4 local_120;
  char *local_118;
  code *local_110;
  undefined4 local_108;
  char *local_100;
  code *local_f8;
  undefined4 local_f0;
  char *local_e8;
  code *local_e0;
  undefined4 local_d8;
  char *local_d0;
  code *local_c8;
  undefined4 local_c0;
  char *local_b8;
  code *local_b0;
  undefined4 local_a8;
  char *local_a0;
  code *local_98;
  undefined4 local_90;
  char *local_88;
  code *local_80;
  undefined4 local_78;
  char *local_70;
  code *local_68;
  undefined4 local_60;
  char *local_58;
  code *local_50;
  undefined4 local_48;
  char *local_40;
  undefined8 local_38;
  undefined4 local_30;
  char *local_28;
  undefined8 local_20;
  undefined4 local_18;
  
  luna::Library::Library(&LStack_2d8,state);
  local_2c8.name_ = "abs";
  local_2c8.field_1.func_ = Abs;
  local_2c8.type_ = ValueT_CFunction;
  local_2b0 = "acos";
  local_2a8 = Acos;
  local_2a0 = 9;
  local_298 = "asin";
  local_290 = Asin;
  local_288 = 9;
  local_280 = "atan";
  local_278 = Atan;
  local_270 = 9;
  local_268 = "atan2";
  local_260 = Atan2;
  local_258 = 9;
  local_250 = "ceil";
  local_248 = Ceil;
  local_240 = 9;
  local_238 = "cos";
  local_230 = Cos;
  local_228 = 9;
  local_220 = "cosh";
  local_218 = Cosh;
  local_210 = 9;
  local_208 = "deg";
  local_200 = Deg;
  local_1f8 = 9;
  local_1f0 = "exp";
  local_1e8 = Exp;
  local_1e0 = 9;
  local_1d8 = "floor";
  local_1d0 = Floor;
  local_1c8 = 9;
  local_1c0 = "fmod";
  local_1b8 = Fmod;
  local_1b0 = 9;
  local_1a8 = "frexp";
  local_1a0 = Frexp;
  local_198 = 9;
  local_190 = "ldexp";
  local_188 = Ldexp;
  local_180 = 9;
  local_178 = "log";
  local_170 = Log;
  local_168 = 9;
  local_160 = "max";
  local_158 = Max;
  local_150 = 9;
  local_148 = "min";
  local_140 = Min;
  local_138 = 9;
  local_130 = "modf";
  local_128 = Modf;
  local_120 = 9;
  local_118 = "pow";
  local_110 = Pow;
  local_108 = 9;
  local_100 = "rad";
  local_f8 = Rad;
  local_f0 = 9;
  local_e8 = "random";
  local_e0 = Random;
  local_d8 = 9;
  local_d0 = "randomseed";
  local_c8 = RandomSeed;
  local_c0 = 9;
  local_b8 = "sin";
  local_b0 = Sin;
  local_a8 = 9;
  local_a0 = "sinh";
  local_98 = Sinh;
  local_90 = 9;
  local_88 = "sqrt";
  local_80 = Sqrt;
  local_78 = 9;
  local_70 = "tan";
  local_68 = Tan;
  local_60 = 9;
  local_58 = "tanh";
  local_50 = Tanh;
  local_48 = 9;
  local_40 = "huge";
  local_38 = 0x7ff0000000000000;
  local_30 = 2;
  local_28 = "pi";
  local_20 = 0x400921fb54442d18;
  local_18 = 2;
  luna::Library::RegisterTableFunction(&LStack_2d8,"math",&local_2c8,0x1d);
  return;
}

Assistant:

void RegisterLibMath(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg math[] = {
            { "abs", Abs },
            { "acos", Acos },
            { "asin", Asin },
            { "atan", Atan },
            { "atan2", Atan2 },
            { "ceil", Ceil },
            { "cos", Cos },
            { "cosh", Cosh },
            { "deg", Deg },
            { "exp", Exp },
            { "floor", Floor },
            { "fmod", Fmod },
            { "frexp", Frexp },
            { "ldexp", Ldexp },
            { "log", Log },
            { "max", Max },
            { "min", Min },
            { "modf", Modf },
            { "pow", Pow },
            { "rad", Rad },
            { "random", Random },
            { "randomseed", RandomSeed },
            { "sin", Sin },
            { "sinh", Sinh },
            { "sqrt", Sqrt },
            { "tan", Tan },
            { "tanh", Tanh },
            { "huge", HUGE_VAL },
            { "pi", M_PI }
        };

        lib.RegisterTableFunction("math", math);
    }